

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O3

void __thiscall bsplib::A2A::~A2A(A2A *this)

{
  pointer piVar1;
  pointer ppoVar2;
  pointer pcVar3;
  pointer puVar4;
  
  if (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null) {
    MPI_Win_free(&this->m_recv_win);
  }
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  piVar1 = (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_ready).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppoVar2 = (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppoVar2 != (pointer)0x0) {
    operator_delete(ppoVar2,(long)(this->m_reqs).
                                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppoVar2
                   );
  }
  pcVar3 = (this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_small_recv_buf).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  pcVar3 = (this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_small_send_buf).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  pcVar3 = (this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  puVar4 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_recv_pos).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_recv_sizes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pcVar3 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  puVar4 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_send_pos).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_send_sizes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->m_lincost).m_counts.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_lincost).m_counts.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->m_lincost).m_sizes.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_lincost).m_sizes.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
    return;
  }
  return;
}

Assistant:

A2A::~A2A()
{
    if ( m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}